

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

bool rr::LineRasterUtil::doesLineSegmentExitDiamond
               (SubpixelLineSegment *line,Vector<long,_2> *diamondCenter)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LINE_SIDE LVar6;
  LINE_SIDE LVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  deUint64 a;
  long *plVar12;
  bool local_521;
  bool local_511;
  bool local_501;
  bool local_4f1;
  bool local_4d2;
  bool local_4d1;
  long local_430;
  long local_420;
  LINE_SIDE sideP1;
  LINE_SIDE sideP0;
  SubpixelLineSegment local_3d0;
  bool local_3a9;
  undefined1 local_3a8 [7];
  bool endVertexInside;
  SubpixelLineSegment local_388;
  bool local_365;
  int local_364;
  undefined1 local_360 [3];
  bool startVertexInside;
  int ndx_1;
  undefined1 local_350 [32];
  undefined1 local_330 [32];
  undefined1 local_310 [32];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [23];
  bool local_299;
  undefined1 local_298 [6];
  bool endIsOutside;
  bool startIsInside;
  undefined1 local_288 [32];
  undefined1 local_268 [24];
  undefined1 local_250 [7];
  bool intersectsAtCorner;
  Vector<long,_2> p;
  undefined1 local_238 [4];
  int ndx;
  DiamondCorners corners [4];
  Vector<long,_2> local_1a8;
  Vector<long,_2> local_198;
  Vector<long,_2> local_188;
  Vector<long,_2> local_178;
  Vector<long,_2> local_168;
  Vector<long,_2> local_158;
  Vector<long,_2> local_148;
  tcu local_138 [8];
  DiamondBound bounds [4];
  deInt64 limitValue;
  bool limitValueCouldOverflow;
  deInt64 lineLengthSquared;
  deInt64 crossProductSquared;
  bool crossProductOverflows;
  deInt64 broadRejectDistanceSquared;
  deInt64 broadRejectDistance;
  deInt64 floorSqrtMaxInt64;
  deInt64 crossProduct;
  Vector<long,_2> v;
  Vector<long,_2> u;
  deInt64 halfPixel;
  Vector<long,_2> *diamondCenter_local;
  SubpixelLineSegment *line_local;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)(v.m_data + 1));
  tcu::operator-((tcu *)&crossProduct,diamondCenter,&line->m_v0);
  lVar8 = tcu::Vector<long,_2>::x((Vector<long,_2> *)(v.m_data + 1));
  lVar9 = tcu::Vector<long,_2>::y((Vector<long,_2> *)&crossProduct);
  lVar10 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(v.m_data + 1));
  lVar11 = tcu::Vector<long,_2>::x((Vector<long,_2> *)&crossProduct);
  local_420 = lVar8 * lVar9 - lVar10 * lVar11;
  bVar1 = local_420 < 0xb504f334;
  bVar3 = -0xb504f334 < local_420;
  if (bVar1 && bVar3) {
    local_420 = local_420 * local_420;
  }
  else {
    local_420 = 0;
  }
  a = tcu::lengthSquared<long,2>((Vector<long,_2> *)(v.m_data + 1));
  iVar4 = deClz64(a);
  iVar5 = deClz64(0x10000);
  bVar2 = 0x3f < (0x80 - iVar5) - iVar4;
  if (bVar2) {
    local_430 = 0;
  }
  else {
    local_430 = a << 0x10;
  }
  if (((bVar1 && bVar3) || (bVar2)) && ((!bVar1 || !bVar3 || ((bVar2 || (local_420 <= local_430)))))
     ) {
    tcu::Vector<long,_2>::Vector(&local_148,0,-0x80);
    tcu::operator+(local_138,diamondCenter,&local_148);
    tcu::Vector<long,_2>::Vector(&local_158,-0x80,0);
    tcu::operator+((tcu *)(bounds[0].p0.m_data + 1),diamondCenter,&local_158);
    bounds[0].p1.m_data[1]._0_1_ = 0;
    tcu::Vector<long,_2>::Vector(&local_168,-0x80,0);
    tcu::operator+((tcu *)&bounds[0].edgeInclusive,diamondCenter,&local_168);
    tcu::Vector<long,_2>::Vector(&local_178,0,0x80);
    tcu::operator+((tcu *)(bounds[1].p0.m_data + 1),diamondCenter,&local_178);
    bounds[1].p1.m_data[1]._0_1_ = 0;
    tcu::Vector<long,_2>::Vector(&local_188,0,0x80);
    tcu::operator+((tcu *)&bounds[1].edgeInclusive,diamondCenter,&local_188);
    tcu::Vector<long,_2>::Vector(&local_198,0x80,0);
    tcu::operator+((tcu *)(bounds[2].p0.m_data + 1),diamondCenter,&local_198);
    bounds[2].p1.m_data[1]._0_1_ = 1;
    tcu::Vector<long,_2>::Vector(&local_1a8,0x80,0);
    tcu::operator+((tcu *)&bounds[2].edgeInclusive,diamondCenter,&local_1a8);
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&corners[3].startBehavior,0,-0x80);
    tcu::operator+((tcu *)(bounds[3].p0.m_data + 1),diamondCenter,
                   (Vector<long,_2> *)&corners[3].startBehavior);
    bounds[3].p1.m_data[1]._0_1_ = 1;
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)local_238,0,-0x80);
    corners[0].dp.m_data[1]._0_1_ = 0;
    corners[0].dp.m_data[1]._4_4_ = 3;
    corners[0].pointInclusive = true;
    corners[0]._17_3_ = 0;
    corners[0].lineBehavior = CORNER_EDGE_CASE_HIT_SECOND_QUARTER;
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&corners[0].startBehavior,-0x80,0);
    corners[1].dp.m_data[1]._0_1_ = 0;
    corners[1].dp.m_data[1]._4_4_ = 0;
    corners[1].pointInclusive = false;
    corners[1]._17_3_ = 0;
    corners[1].lineBehavior = CORNER_EDGE_CASE_HIT;
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&corners[1].startBehavior,0,0x80);
    corners[2].dp.m_data[1]._0_1_ = 0;
    corners[2].dp.m_data[1]._4_4_ = 2;
    corners[2].pointInclusive = true;
    corners[2]._17_3_ = 0;
    corners[2].lineBehavior = CORNER_EDGE_CASE_HIT_FIRST_QUARTER;
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)&corners[2].startBehavior,0x80,0);
    corners[3].dp.m_data[1]._0_1_ = 1;
    corners[3].dp.m_data[1]._4_4_ = 1;
    corners[3].pointInclusive = true;
    corners[3]._17_3_ = 0;
    corners[3].lineBehavior = CORNER_EDGE_CASE_NONE;
    for (p.m_data[1]._4_4_ = 0; p.m_data[1]._4_4_ < 4; p.m_data[1]._4_4_ = p.m_data[1]._4_4_ + 1) {
      tcu::operator+((tcu *)local_250,diamondCenter,
                     (Vector<long,_2> *)(local_238 + (long)p.m_data[1]._4_4_ * 0x20));
      local_268[0x17] = vertexOnLineSegment((Vector<long,_2> *)local_250,line);
      if ((bool)local_268[0x17]) {
        bVar3 = tcu::Vector<long,_2>::operator!=((Vector<long,_2> *)local_250,&line->m_v0);
        if ((bVar3) &&
           (bVar3 = tcu::Vector<long,_2>::operator!=((Vector<long,_2> *)local_250,&line->m_v1),
           bVar3)) {
          if (*(int *)((long)corners[p.m_data[1]._4_4_].dp.m_data + 0xc) == 1) {
            return true;
          }
          bVar3 = false;
          if (*(int *)((long)corners[p.m_data[1]._4_4_].dp.m_data + 0xc) == 2) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_268);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_268);
            lVar8 = *plVar12;
            SubpixelLineSegment::direction((SubpixelLineSegment *)(local_288 + 0x10));
            plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(local_288 + 0x10));
            bVar3 = lVar8 * *plVar12 < 1;
          }
          if (bVar3) {
            return true;
          }
          bVar3 = false;
          if (*(int *)((long)corners[p.m_data[1]._4_4_].dp.m_data + 0xc) == 3) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_288);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_288);
            lVar8 = *plVar12;
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_298);
            plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)local_298);
            bVar3 = 0 < lVar8 * *plVar12;
          }
          if (bVar3) {
            return true;
          }
        }
        bVar3 = lineInCornerAngleRange
                          (line,(Vector<long,_2> *)(local_238 + (long)p.m_data[1]._4_4_ * 0x20));
        if (bVar3) {
          local_4d1 = true;
          if ((corners[p.m_data[1]._4_4_].dp.m_data[1] & 1) == 0) {
            local_4d1 = tcu::Vector<long,_2>::operator!=((Vector<long,_2> *)local_250,&line->m_v0);
          }
          local_299 = local_4d1;
          local_4d2 = true;
          if ((corners[p.m_data[1]._4_4_].dp.m_data[1] & 1) != 0) {
            local_4d2 = tcu::Vector<long,_2>::operator!=((Vector<long,_2> *)local_250,&line->m_v1);
          }
          local_2b0[0x16] = local_4d2;
          if (((local_299 & 1U) != 0) && (local_4d2 != false)) {
            return true;
          }
        }
        bVar3 = tcu::Vector<long,_2>::operator==((Vector<long,_2> *)local_250,&line->m_v1);
        if (bVar3) {
          if ((((corners[p.m_data[1]._4_4_].lineBehavior == CORNER_EDGE_CASE_HIT) ||
               (corners[p.m_data[1]._4_4_].lineBehavior == CORNER_EDGE_CASE_HIT_FIRST_QUARTER)) ||
              (corners[p.m_data[1]._4_4_].lineBehavior == CORNER_EDGE_CASE_HIT_SECOND_QUARTER)) &&
             (bVar3 = lineInCornerAngleRange
                                (line,(Vector<long,_2> *)
                                      (local_238 + (long)p.m_data[1]._4_4_ * 0x20)), bVar3)) {
            return true;
          }
          bVar3 = false;
          if (corners[p.m_data[1]._4_4_].lineBehavior == CORNER_EDGE_CASE_HIT_FIRST_QUARTER) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_2b0);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_2b0);
            bVar3 = false;
            if (*plVar12 < 0) {
              SubpixelLineSegment::direction((SubpixelLineSegment *)(local_2d0 + 0x10));
              plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(local_2d0 + 0x10));
              bVar3 = 0 < *plVar12;
            }
          }
          if (bVar3) {
            return true;
          }
          bVar3 = false;
          if (corners[p.m_data[1]._4_4_].lineBehavior == CORNER_EDGE_CASE_HIT_SECOND_QUARTER) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_2d0);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_2d0);
            bVar3 = false;
            if (0 < *plVar12) {
              SubpixelLineSegment::direction((SubpixelLineSegment *)(local_2f0 + 0x10));
              plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(local_2f0 + 0x10));
              bVar3 = 0 < *plVar12;
            }
          }
          if (bVar3) {
            return true;
          }
        }
        bVar3 = tcu::Vector<long,_2>::operator==((Vector<long,_2> *)local_250,&line->m_v0);
        if (bVar3) {
          if ((*(int *)&corners[p.m_data[1]._4_4_].pointInclusive == 1) &&
             (bVar3 = lineInCornerOutsideAngleRange
                                (line,(Vector<long,_2> *)
                                      (local_238 + (long)p.m_data[1]._4_4_ * 0x20)), bVar3)) {
            return true;
          }
          bVar3 = false;
          if (*(int *)&corners[p.m_data[1]._4_4_].pointInclusive == 2) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_2f0);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_2f0);
            bVar3 = false;
            if (0 < *plVar12) {
              SubpixelLineSegment::direction((SubpixelLineSegment *)(local_310 + 0x10));
              plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(local_310 + 0x10));
              bVar3 = false;
              if (0 < *plVar12) {
                SubpixelLineSegment::direction((SubpixelLineSegment *)local_310);
                plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)local_310);
                lVar8 = *plVar12;
                SubpixelLineSegment::direction((SubpixelLineSegment *)(local_330 + 0x10));
                plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)(local_330 + 0x10));
                bVar3 = lVar8 <= *plVar12;
              }
            }
          }
          if (bVar3) {
            return true;
          }
          bVar3 = false;
          if (*(int *)&corners[p.m_data[1]._4_4_].pointInclusive == 3) {
            SubpixelLineSegment::direction((SubpixelLineSegment *)local_330);
            plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_330);
            bVar3 = false;
            if (0 < *plVar12) {
              SubpixelLineSegment::direction((SubpixelLineSegment *)(local_350 + 0x10));
              plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)(local_350 + 0x10));
              bVar3 = false;
              if (*plVar12 < 1) {
                SubpixelLineSegment::direction((SubpixelLineSegment *)local_350);
                plVar12 = tcu::Vector<long,_2>::y((Vector<long,_2> *)local_350);
                lVar8 = *plVar12;
                SubpixelLineSegment::direction((SubpixelLineSegment *)local_360);
                plVar12 = tcu::Vector<long,_2>::x((Vector<long,_2> *)local_360);
                bVar3 = -lVar8 <= *plVar12;
              }
            }
          }
          if (bVar3) {
            return true;
          }
        }
      }
    }
    for (local_364 = 0; local_364 < 4; local_364 = local_364 + 1) {
      SubpixelLineSegment::SubpixelLineSegment
                (&local_388,(Vector<long,_2> *)&bounds[(long)local_364 + -1].edgeInclusive,
                 (Vector<long,_2> *)(bounds[local_364].p0.m_data + 1));
      bVar3 = vertexOnLeftSideOfLine(&line->m_v0,&local_388);
      local_4f1 = true;
      if (!bVar3) {
        local_501 = false;
        if ((bounds[local_364].p1.m_data[1] & 1) != 0) {
          SubpixelLineSegment::SubpixelLineSegment
                    ((SubpixelLineSegment *)local_3a8,
                     (Vector<long,_2> *)&bounds[(long)local_364 + -1].edgeInclusive,
                     (Vector<long,_2> *)(bounds[local_364].p0.m_data + 1));
          local_501 = vertexOnLine(&line->m_v0,(SubpixelLineSegment *)local_3a8);
        }
        local_4f1 = local_501;
      }
      local_365 = local_4f1;
      SubpixelLineSegment::SubpixelLineSegment
                (&local_3d0,(Vector<long,_2> *)&bounds[(long)local_364 + -1].edgeInclusive,
                 (Vector<long,_2> *)(bounds[local_364].p0.m_data + 1));
      bVar3 = vertexOnLeftSideOfLine(&line->m_v1,&local_3d0);
      local_511 = true;
      if (!bVar3) {
        local_521 = false;
        if ((bounds[local_364].p1.m_data[1] & 1) != 0) {
          SubpixelLineSegment::SubpixelLineSegment
                    ((SubpixelLineSegment *)&sideP1,
                     (Vector<long,_2> *)&bounds[(long)local_364 + -1].edgeInclusive,
                     (Vector<long,_2> *)(bounds[local_364].p0.m_data + 1));
          local_521 = vertexOnLine(&line->m_v1,(SubpixelLineSegment *)&sideP1);
        }
        local_511 = local_521;
      }
      local_3a9 = local_511;
      if (((local_365 & 1U) != 0) && (local_511 == false)) {
        LVar6 = getVertexSide((Vector<long,_2> *)&bounds[(long)local_364 + -1].edgeInclusive,line);
        LVar7 = getVertexSide((Vector<long,_2> *)(bounds[local_364].p0.m_data + 1),line);
        if ((LVar6 != LINE_SIDE_INTERSECT) && ((LVar7 != LINE_SIDE_INTERSECT && (LVar6 != LVar7))))
        {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool doesLineSegmentExitDiamond (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& diamondCenter)
{
	DE_ASSERT(isTheCenterOfTheFragment(diamondCenter));

	// Diamond Center is at diamondCenter in subpixel coords

	const deInt64 halfPixel = 1ll << (RASTERIZER_SUBPIXEL_BITS-1);

	// Reject distant diamonds early
	{
		const tcu::Vector<deInt64,2>	u				= line.direction();
		const tcu::Vector<deInt64,2>	v				= (diamondCenter - line.m_v0);
		const deInt64					crossProduct	= (u.x() * v.y() - u.y() * v.x());

		// crossProduct = |p| |l| sin(theta)
		// distanceFromLine = |p| sin(theta)
		// => distanceFromLine = crossProduct / |l|
		//
		// |distanceFromLine| > C
		// => distanceFromLine^2 > C^2
		// => crossProduct^2 / |l|^2 > C^2
		// => crossProduct^2 > |l|^2 * C^2

		const deInt64	floorSqrtMaxInt64			= 3037000499LL; //!< floor(sqrt(MAX_INT64))

		const deInt64	broadRejectDistance			= 2 * halfPixel;
		const deInt64	broadRejectDistanceSquared	= broadRejectDistance * broadRejectDistance;
		const bool		crossProductOverflows		= (crossProduct > floorSqrtMaxInt64 || crossProduct < -floorSqrtMaxInt64);
		const deInt64	crossProductSquared			= (crossProductOverflows) ? (0) : (crossProduct * crossProduct); // avoid overflow
		const deInt64	lineLengthSquared			= tcu::lengthSquared(u);
		const bool		limitValueCouldOverflow		= ((64 - deClz64(lineLengthSquared)) + (64 - deClz64(broadRejectDistanceSquared))) > 63;
		const deInt64	limitValue					= (limitValueCouldOverflow) ? (0) : (lineLengthSquared * broadRejectDistanceSquared); // avoid overflow

		// only cross overflows
		if (crossProductOverflows && !limitValueCouldOverflow)
			return false;

		// both representable
		if (!crossProductOverflows && !limitValueCouldOverflow)
		{
			if (crossProductSquared > limitValue)
				return false;
		}
	}

	const struct DiamondBound
	{
		tcu::Vector<deInt64,2>	p0;
		tcu::Vector<deInt64,2>	p1;
		bool					edgeInclusive; // would a point on the bound be inside of the region
	} bounds[] =
	{
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				-halfPixel),	diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				diamondCenter + tcu::Vector<deInt64,2>(0,			halfPixel),		 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				halfPixel),		diamondCenter + tcu::Vector<deInt64,2>(halfPixel,	0),				 true	},
		{ diamondCenter + tcu::Vector<deInt64,2>(halfPixel,		0),				diamondCenter + tcu::Vector<deInt64,2>(0,			-halfPixel),	 true	},
	};

	const struct DiamondCorners
	{
		enum CORNER_EDGE_CASE_BEHAVIOR
		{
			CORNER_EDGE_CASE_NONE,							// if the line intersects just a corner, no entering or exiting
			CORNER_EDGE_CASE_HIT,							// if the line intersects just a corner, entering and exit
			CORNER_EDGE_CASE_HIT_FIRST_QUARTER,				// if the line intersects just a corner and the line has either endpoint in (+X,-Y) direction (preturbing moves the line inside)
			CORNER_EDGE_CASE_HIT_SECOND_QUARTER				// if the line intersects just a corner and the line has either endpoint in (+X,+Y) direction (preturbing moves the line inside)
		};
		enum CORNER_START_CASE_BEHAVIOR
		{
			CORNER_START_CASE_NONE,							// the line starting point is outside, no exiting
			CORNER_START_CASE_OUTSIDE,						// exit, if line does not intersect the region (preturbing moves the start point inside)
			CORNER_START_CASE_POSITIVE_Y_45,				// exit, if line the angle of line vector and X-axis is in range (0, 45] in positive Y side.
			CORNER_START_CASE_NEGATIVE_Y_45					// exit, if line the angle of line vector and X-axis is in range [0, 45] in negative Y side.
		};
		enum CORNER_END_CASE_BEHAVIOR
		{
			CORNER_END_CASE_NONE,							// end is inside, no exiting (preturbing moves the line end inside)
			CORNER_END_CASE_DIRECTION,						// exit, if line intersected the region (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER,	// exit, if line intersected the region, or line originates from (+X,-Y) direction (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER	// exit, if line intersected the region, or line originates from (+X,+Y) direction (preturbing moves the line end outside)
		};

		tcu::Vector<deInt64,2>		dp;
		bool						pointInclusive;			// would a point in this corner intersect with the region
		CORNER_EDGE_CASE_BEHAVIOR	lineBehavior;			// would a line segment going through this corner intersect with the region
		CORNER_START_CASE_BEHAVIOR	startBehavior;			// how the corner behaves if the start point at the corner
		CORNER_END_CASE_BEHAVIOR	endBehavior;			// how the corner behaves if the end point at the corner
	} corners[] =
	{
		{ tcu::Vector<deInt64,2>(0,				-halfPixel),	false,	DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER,	DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER},
		{ tcu::Vector<deInt64,2>(-halfPixel,	0),				false,	DiamondCorners::CORNER_EDGE_CASE_NONE,					DiamondCorners::CORNER_START_CASE_NONE,				DiamondCorners::CORNER_END_CASE_DIRECTION					},
		{ tcu::Vector<deInt64,2>(0,				halfPixel),		false,	DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER,		DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER	},
		{ tcu::Vector<deInt64,2>(halfPixel,		0),				true,	DiamondCorners::CORNER_EDGE_CASE_HIT,					DiamondCorners::CORNER_START_CASE_OUTSIDE,			DiamondCorners::CORNER_END_CASE_NONE						},
	};

	// Corner cases at the corners
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(corners); ++ndx)
	{
		const tcu::Vector<deInt64,2> p	= diamondCenter + corners[ndx].dp;
		const bool intersectsAtCorner	= LineRasterUtil::vertexOnLineSegment(p, line);

		if (!intersectsAtCorner)
			continue;

		// line segment body intersects with the corner
		if (p != line.m_v0 && p != line.m_v1)
		{
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT)
				return true;

			// endpoint in (+X, -Y) (X or Y may be 0) direction <==> x*y <= 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER &&
				(line.direction().x() * line.direction().y()) <= 0)
				return true;

			// endpoint in (+X, +Y) (Y > 0) direction <==> x*y > 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER &&
				(line.direction().x() * line.direction().y()) > 0)
				return true;
		}

		// line exits the area at the corner
		if (lineInCornerAngleRange(line, corners[ndx].dp))
		{
			const bool startIsInside = corners[ndx].pointInclusive || p != line.m_v0;
			const bool endIsOutside = !corners[ndx].pointInclusive || p != line.m_v1;

			// starting point is inside the region and end endpoint is outside
			if (startIsInside && endIsOutside)
				return true;
		}

		// line end is at the corner
		if (p == line.m_v1)
		{
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER)
			{
				// did the line intersect the region
				if (lineInCornerAngleRange(line, corners[ndx].dp))
					return true;
			}

			// due to the perturbed endpoint, lines at this the angle will cause and enter-exit pair
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER &&
				line.direction().x() < 0 &&
				line.direction().y() > 0)
				return true;
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER &&
				line.direction().x() > 0 &&
				line.direction().y() > 0)
				return true;
		}

		// line start is at the corner
		if (p == line.m_v0)
		{
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_OUTSIDE)
			{
				// if the line is not going inside, it will exit
				if (lineInCornerOutsideAngleRange(line, corners[ndx].dp))
					return true;
			}

			// exit, if line the angle between line vector and X-axis is in range (0, 45] in positive Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45 &&
				line.direction().x() > 0 &&
				line.direction().y() > 0 &&
				line.direction().y() <= line.direction().x())
				return true;

			// exit, if line the angle between line vector and X-axis is in range [0, 45] in negative Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45 &&
				 line.direction().x() > 0 &&
				 line.direction().y() <= 0 &&
				-line.direction().y() <= line.direction().x())
				return true;
		}
	}

	// Does the line intersect boundary at the left == exits the diamond
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bounds); ++ndx)
	{
		const bool startVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));
		const bool endVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));

		// start must be on inside this half space (left or at the inclusive boundary)
		if (!startVertexInside)
			continue;

		// end must be outside of this half-space (right or at non-inclusive boundary)
		if (endVertexInside)
			continue;

		// Does the line via v0 and v1 intersect the line segment p0-p1
		// <==> p0 and p1 are the different sides (LEFT, RIGHT) of the v0-v1 line.
		// Corners are not allowed, they are checked already
		LineRasterUtil::LINE_SIDE sideP0 = LineRasterUtil::getVertexSide(bounds[ndx].p0, line);
		LineRasterUtil::LINE_SIDE sideP1 = LineRasterUtil::getVertexSide(bounds[ndx].p1, line);

		if (sideP0 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP1 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP0 != sideP1)
			return true;
	}

	return false;
}